

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O3

int elf_initialize_syminfo
              (backtrace_state *state,libbacktrace_base_address base_address,uchar *symtab_data,
              size_t symtab_size,uchar *strtab,size_t strtab_size,
              backtrace_error_callback error_callback,void *data,elf_syminfo_data *sdata,
              elf_ppc64_opd_data *opd)

{
  ulong uVar1;
  uint uVar2;
  elf_symbol *p;
  short *psVar3;
  size_t count;
  ulong uVar4;
  ulong uVar5;
  
  if (symtab_size < 0x18) {
    count = 0;
    p = (elf_symbol *)tcmalloc_backtrace_alloc(state,0,error_callback,data);
    if (p == (elf_symbol *)0x0) {
      return 0;
    }
  }
  else {
    uVar5 = symtab_size / 0x18;
    psVar3 = (short *)(symtab_data + 6);
    count = 0;
    uVar4 = uVar5;
    do {
      if ((byte)((*(byte *)(psVar3 + -1) & 0xf) - 1) < 2) {
        count = (count + 1) - (ulong)(*psVar3 == 0);
      }
      psVar3 = psVar3 + 0xc;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    p = (elf_symbol *)tcmalloc_backtrace_alloc(state,count * 0x18,error_callback,data);
    if (p == (elf_symbol *)0x0) {
      return 0;
    }
    if (0x17 < symtab_size) {
      uVar2 = 0;
      do {
        if ((0xfd < (byte)(((byte)*(uint *)((long)symtab_data + 4) & 0xf) - 3)) &&
           (*(short *)((long)symtab_data + 6) != 0)) {
          if (strtab_size <= *(uint *)symtab_data) {
            (*error_callback)(data,"symbol string index out of range",0);
            tcmalloc_backtrace_free(state,p,count * 0x18,error_callback,data);
            return 0;
          }
          p[uVar2].name = (char *)(strtab + *(uint *)symtab_data);
          uVar4 = *(ulong *)((long)symtab_data + 8);
          if (opd != (elf_ppc64_opd_data *)0x0) {
            uVar1 = opd->addr;
            if ((uVar1 <= uVar4) && (uVar4 < uVar1 + opd->size)) {
              uVar4 = *(ulong *)(opd->data + (uVar4 - uVar1));
            }
          }
          p[uVar2].address = uVar4 + base_address.m;
          p[uVar2].size = *(size_t *)((long)symtab_data + 0x10);
          uVar2 = uVar2 + 1;
        }
        symtab_data = (uchar *)((long)symtab_data + 0x18);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
  }
  tcmalloc_backtrace_qsort(p,count,0x18,elf_symbol_compare);
  sdata->next = (elf_syminfo_data *)0x0;
  sdata->symbols = p;
  sdata->count = count;
  return 1;
}

Assistant:

static int
elf_initialize_syminfo (struct backtrace_state *state,
			struct libbacktrace_base_address base_address,
			const unsigned char *symtab_data, size_t symtab_size,
			const unsigned char *strtab, size_t strtab_size,
			backtrace_error_callback error_callback,
			void *data, struct elf_syminfo_data *sdata,
			struct elf_ppc64_opd_data *opd)
{
  size_t sym_count;
  const b_elf_sym *sym;
  size_t elf_symbol_count;
  size_t elf_symbol_size;
  struct elf_symbol *elf_symbols;
  size_t i;
  unsigned int j;

  sym_count = symtab_size / sizeof (b_elf_sym);

  /* We only care about function symbols.  Count them.  */
  sym = (const b_elf_sym *) symtab_data;
  elf_symbol_count = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if ((info == STT_FUNC || info == STT_OBJECT)
	  && sym->st_shndx != SHN_UNDEF)
	++elf_symbol_count;
    }

  elf_symbol_size = elf_symbol_count * sizeof (struct elf_symbol);
  elf_symbols = ((struct elf_symbol *)
		 backtrace_alloc (state, elf_symbol_size, error_callback,
				  data));
  if (elf_symbols == NULL)
    return 0;

  sym = (const b_elf_sym *) symtab_data;
  j = 0;
  for (i = 0; i < sym_count; ++i, ++sym)
    {
      int info;

      info = sym->st_info & 0xf;
      if (info != STT_FUNC && info != STT_OBJECT)
	continue;
      if (sym->st_shndx == SHN_UNDEF)
	continue;
      if (sym->st_name >= strtab_size)
	{
	  error_callback (data, "symbol string index out of range", 0);
	  backtrace_free (state, elf_symbols, elf_symbol_size, error_callback,
			  data);
	  return 0;
	}
      elf_symbols[j].name = (const char *) strtab + sym->st_name;
      /* Special case PowerPC64 ELFv1 symbols in .opd section, if the symbol
	 is a function descriptor, read the actual code address from the
	 descriptor.  */
      if (opd
	  && sym->st_value >= opd->addr
	  && sym->st_value < opd->addr + opd->size)
	elf_symbols[j].address
	  = *(const b_elf_addr *) (opd->data + (sym->st_value - opd->addr));
      else
	elf_symbols[j].address = sym->st_value;
      elf_symbols[j].address =
	libbacktrace_add_base (elf_symbols[j].address, base_address);
      elf_symbols[j].size = sym->st_size;
      ++j;
    }

  backtrace_qsort (elf_symbols, elf_symbol_count, sizeof (struct elf_symbol),
		   elf_symbol_compare);

  sdata->next = NULL;
  sdata->symbols = elf_symbols;
  sdata->count = elf_symbol_count;

  return 1;
}